

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh_arch.cc
# Opt level: O2

string * SleighArchitecture::normalizeSize(string *__return_storage_ptr__,string *nm)

{
  ulong uVar1;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)nm);
  uVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x36a4a8);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar1);
  }
  uVar1 = std::__cxx11::string::find((char)__return_storage_ptr__,0x2d);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

string SleighArchitecture::normalizeSize(const string &nm)

{
  string res = nm;
  string::size_type pos;
  
  pos = res.find("bit");
  if (pos != string::npos)
    res.erase(pos,3);
  pos = res.find('-');
  if (pos != string::npos)
    res.erase(pos,1);
  return res;
}